

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

TryEmplaceResult * __thiscall
QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,QTextureGlyphCache::Coord>::
tryEmplace_impl<QTextureGlyphCache::GlyphAndSubPixelPosition_const&>
          (TryEmplaceResult *__return_storage_ptr__,
          QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,QTextureGlyphCache::Coord> *this,
          GlyphAndSubPixelPosition *key)

{
  uchar uVar1;
  Span *pSVar2;
  Bucket BVar3;
  QFixed QVar4;
  long lVar5;
  size_t hash;
  Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
  *pDVar6;
  Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord> *pNVar7;
  long in_FS_OFFSET;
  Bucket BVar8;
  Bucket local_50;
  QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)this;
  if (lVar5 == 0) {
    QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>::detach
              ((QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord> *)
               this);
    lVar5 = *(long *)this;
  }
  local_40.d = (Data *)0x0;
  hash = ::qHash(key,*(size_t *)(lVar5 + 0x18));
  BVar8 = QHashPrivate::
          Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
          ::findBucketWithHash<QTextureGlyphCache::GlyphAndSubPixelPosition>
                    (*(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
                       **)this,key,hash);
  uVar1 = (BVar8.span)->offsets[BVar8.index];
  pDVar6 = *(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
             **)this;
  local_50 = BVar8;
  if ((pDVar6 == (Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
                  *)0x0) || (1 < (uint)(pDVar6->ref).atomic._q_value.super___atomic_base<int>)) {
LAB_0037cbdb:
    QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>::operator=
              (&local_40,
               (QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord> *)
               this);
    pDVar6 = *(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
               **)this;
    if ((uVar1 == 0xff) && (pDVar6->numBuckets >> 1 <= pDVar6->size)) {
      pDVar6 = QHashPrivate::
               Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
               ::detached(pDVar6,pDVar6->size + 1);
      *(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
        **)this = pDVar6;
      local_50 = QHashPrivate::
                 Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
                 ::findBucketWithHash<QTextureGlyphCache::GlyphAndSubPixelPosition>(pDVar6,key,hash)
      ;
    }
    else {
      pSVar2 = pDVar6->spans;
      pDVar6 = QHashPrivate::
               Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
               ::detached(pDVar6);
      *(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
        **)this = pDVar6;
      local_50.index._0_4_ = (uint)BVar8.index & 0x7f;
      BVar3.index._0_4_ = (uint)local_50.index;
      BVar3.span = pDVar6->spans +
                   ((((long)BVar8.span - (long)pSVar2) / 0x90 << 7 | BVar8.index) >> 7);
      BVar3.index._4_4_ = 0;
      local_50.span =
           pDVar6->spans + ((((long)BVar8.span - (long)pSVar2) / 0x90 << 7 | BVar8.index) >> 7);
      local_50.index._4_4_ = 0;
      if (uVar1 != 0xff) {
        pDVar6 = *(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
                   **)this;
        BVar8 = BVar3;
        goto LAB_0037ccab;
      }
    }
  }
  else {
    if (uVar1 != 0xff) goto LAB_0037ccab;
    if (pDVar6->numBuckets >> 1 <= pDVar6->size) goto LAB_0037cbdb;
  }
  pNVar7 = QHashPrivate::
           Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
           ::Bucket::insert(&local_50);
  QVar4.val = (key->subPixelPosition).x.val;
  (pNVar7->key).glyph = key->glyph;
  (pNVar7->key).subPixelPosition.x = (QFixed)QVar4.val;
  (pNVar7->key).subPixelPosition.y.val = (key->subPixelPosition).y.val;
  (pNVar7->value).x = 0;
  (pNVar7->value).y = 0;
  (pNVar7->value).w = 0;
  (pNVar7->value).h = 0;
  (pNVar7->value).baseLineX = 0;
  (pNVar7->value).baseLineY = 0;
  pDVar6 = *(Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
             **)this;
  pDVar6->size = pDVar6->size + 1;
  BVar8 = local_50;
LAB_0037ccab:
  pSVar2 = pDVar6->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar6;
  (__return_storage_ptr__->iterator).i.bucket =
       ((long)BVar8.span - (long)pSVar2) / 0x90 << 7 | BVar8.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }